

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Master.cpp
# Opt level: O1

void __thiscall
Master::freeROMImages(Master *this,ROMImage **controlROMImage,ROMImage **pcmROMImage)

{
  QArrayData *pQVar1;
  SynthRoute **ppSVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  File *pFVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ROMImage *synthPCMROMImage;
  ROMImage *synthControlROMImage;
  ROMImage *local_40;
  ROMImage *local_38;
  
  if (*pcmROMImage != (ROMImage *)0x0 || *controlROMImage != (ROMImage *)0x0) {
    bVar9 = false;
    local_38 = (ROMImage *)0x0;
    local_40 = (ROMImage *)0x0;
    if (this->audioFileWriterSynth == (QSynth *)0x0) {
      bVar8 = false;
    }
    else {
      QSynth::getROMImages(this->audioFileWriterSynth,&local_38,&local_40);
      bVar8 = local_38 == *controlROMImage;
      bVar9 = local_40 == *pcmROMImage;
      if (bVar8 && bVar9) {
        return;
      }
    }
    pQVar1 = &((this->synthRoutes).d.d)->super_QArrayData;
    ppSVar2 = (this->synthRoutes).d.ptr;
    lVar3 = (this->synthRoutes).d.size;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar10 = lVar3 == 0;
    if (!bVar10) {
      lVar7 = 0;
      bVar4 = bVar8;
      bVar5 = bVar9;
      do {
        SynthRoute::getROMImages(*(SynthRoute **)((long)ppSVar2 + lVar7),&local_38,&local_40);
        bVar8 = (bool)(bVar4 | local_38 == *controlROMImage);
        bVar9 = (bool)(bVar5 | local_40 == *pcmROMImage);
        if (((bool)(bVar4 | local_38 == *controlROMImage)) && (bVar5 || local_40 == *pcmROMImage))
        break;
        lVar7 = lVar7 + 8;
        bVar10 = lVar3 << 3 == lVar7;
        bVar4 = bVar8;
        bVar5 = bVar9;
      } while (!bVar10);
    }
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,8,8);
      }
    }
    if (bVar10) {
      if ((!bVar8) && (*controlROMImage != (ROMImage *)0x0)) {
        bVar8 = MT32Emu::ROMImage::isFileUserProvided(*controlROMImage);
        if ((bVar8) &&
           (pFVar6 = MT32Emu::ROMImage::getFile(*controlROMImage), pFVar6 != (File *)0x0)) {
          (*pFVar6->_vptr_File[1])(pFVar6);
        }
        MT32Emu::ROMImage::freeROMImage(*controlROMImage);
        *controlROMImage = (ROMImage *)0x0;
      }
      if ((!bVar9) && (*pcmROMImage != (ROMImage *)0x0)) {
        bVar9 = MT32Emu::ROMImage::isFileUserProvided(*pcmROMImage);
        if ((bVar9) && (pFVar6 = MT32Emu::ROMImage::getFile(*pcmROMImage), pFVar6 != (File *)0x0)) {
          (*pFVar6->_vptr_File[1])(pFVar6);
        }
        MT32Emu::ROMImage::freeROMImage(*pcmROMImage);
        *pcmROMImage = (ROMImage *)0x0;
      }
    }
  }
  return;
}

Assistant:

void Master::freeROMImages(const MT32Emu::ROMImage *&controlROMImage, const MT32Emu::ROMImage *&pcmROMImage) const {
	if (controlROMImage == NULL && pcmROMImage == NULL) return;
	bool controlROMInUse = false;
	bool pcmROMInUse = false;
	const MT32Emu::ROMImage *synthControlROMImage = NULL;
	const MT32Emu::ROMImage *synthPCMROMImage = NULL;
	if (audioFileWriterSynth != NULL) {
		audioFileWriterSynth->getROMImages(synthControlROMImage, synthPCMROMImage);
		controlROMInUse = synthControlROMImage == controlROMImage;
		pcmROMInUse = synthPCMROMImage == pcmROMImage;
		if (controlROMInUse && pcmROMInUse) return;
	}
	foreach (SynthRoute *synthRoute, synthRoutes) {
		synthRoute->getROMImages(synthControlROMImage, synthPCMROMImage);
		controlROMInUse = controlROMInUse || (synthControlROMImage == controlROMImage);
		pcmROMInUse = pcmROMInUse || (synthPCMROMImage == pcmROMImage);
		if (controlROMInUse && pcmROMInUse) return;
	}
	if (!controlROMInUse && controlROMImage != NULL) {
		if (controlROMImage->isFileUserProvided()) delete controlROMImage->getFile();
		MT32Emu::ROMImage::freeROMImage(controlROMImage);
		controlROMImage = NULL;
	}
	if (!pcmROMInUse && pcmROMImage != NULL) {
		if (pcmROMImage->isFileUserProvided()) delete pcmROMImage->getFile();
		MT32Emu::ROMImage::freeROMImage(pcmROMImage);
		pcmROMImage = NULL;
	}
}